

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O2

void __thiscall hmi::window::~window(window *this)

{
  if (this->m_window != (SDL_Window *)0x0) {
    SDL_DestroyWindow();
  }
  LOCK();
  (anonymous_namespace)::g_loaded = (anonymous_namespace)::g_loaded + -1;
  UNLOCK();
  if ((anonymous_namespace)::g_loaded == 0) {
    SDL_Quit();
  }
  return;
}

Assistant:

window::~window() {
    if (m_window != nullptr) {
      SDL_DestroyWindow(m_window);
    }

    if (g_loaded.fetch_sub(1) == 1) { // we are the last
      SDL_Quit();
    }
  }